

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dos_blocker.cpp
# Opt level: O1

bool __thiscall
libtorrent::dht::dos_blocker::incoming
          (dos_blocker *this,address *addr,time_point now,dht_logger *logger)

{
  anon_enum_32 aVar1;
  undefined8 uVar2;
  node_ban_entry *pnVar3;
  int iVar4;
  int iVar5;
  address *addr_00;
  node_ban_entry *pnVar6;
  address_v6 *paVar7;
  ulong uVar8;
  bool bVar9;
  node_ban_entry *pnVar10;
  undefined1 auVar11 [16];
  string local_50;
  
  pnVar6 = this->m_ban_nodes;
  paVar7 = &this->m_ban_nodes[0].src.ipv6_address_;
  uVar8 = 0xffffffffffffffd8;
  pnVar10 = pnVar6;
  do {
    aVar1 = (pnVar6->src).type_;
    if (aVar1 == addr->type_) {
      if (aVar1 == ipv6) {
        auVar11[0] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0] ==
                      (paVar7->addr_).__in6_u.__u6_addr8[0]);
        auVar11[1] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[1] ==
                      (paVar7->addr_).__in6_u.__u6_addr8[1]);
        auVar11[2] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[2] ==
                      (paVar7->addr_).__in6_u.__u6_addr8[2]);
        auVar11[3] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[3] ==
                      (paVar7->addr_).__in6_u.__u6_addr8[3]);
        auVar11[4] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[4] ==
                      (paVar7->addr_).__in6_u.__u6_addr8[4]);
        auVar11[5] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[5] ==
                      (paVar7->addr_).__in6_u.__u6_addr8[5]);
        auVar11[6] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[6] ==
                      (paVar7->addr_).__in6_u.__u6_addr8[6]);
        auVar11[7] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[7] ==
                      (paVar7->addr_).__in6_u.__u6_addr8[7]);
        auVar11[8] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[8] ==
                      (paVar7->addr_).__in6_u.__u6_addr8[8]);
        auVar11[9] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[9] ==
                      (paVar7->addr_).__in6_u.__u6_addr8[9]);
        auVar11[10] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[10] ==
                       (paVar7->addr_).__in6_u.__u6_addr8[10]);
        auVar11[0xb] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xb] ==
                        (paVar7->addr_).__in6_u.__u6_addr8[0xb]);
        auVar11[0xc] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xc] ==
                        (paVar7->addr_).__in6_u.__u6_addr8[0xc]);
        auVar11[0xd] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xd] ==
                        (paVar7->addr_).__in6_u.__u6_addr8[0xd]);
        auVar11[0xe] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xe] ==
                        (paVar7->addr_).__in6_u.__u6_addr8[0xe]);
        auVar11[0xf] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xf] ==
                        (paVar7->addr_).__in6_u.__u6_addr8[0xf]);
        bVar9 = (pnVar6->src).ipv6_address_.scope_id_ == (addr->ipv6_address_).scope_id_ &&
                (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar11[0xf] >> 7) << 0xf) == 0xffff;
      }
      else {
        bVar9 = (pnVar6->src).ipv4_address_.addr_.s_addr == (addr->ipv4_address_).addr_.s_addr;
      }
      if (bVar9) goto LAB_003535e2;
    }
    pnVar3 = pnVar6;
    if ((pnVar10->count <= pnVar6->count) &&
       ((pnVar6->count != pnVar10->count || ((pnVar10->limit).__d.__r <= (pnVar6->limit).__d.__r))))
    {
      pnVar3 = pnVar10;
    }
    pnVar10 = pnVar3;
    pnVar6 = pnVar6 + 1;
    paVar7 = paVar7 + 2;
    uVar8 = uVar8 + 0x30;
  } while (uVar8 < 0x398);
  pnVar6 = (node_ban_entry *)0x0;
LAB_003535e2:
  if (pnVar6 == (node_ban_entry *)0x0) {
    pnVar10->count = 1;
    (pnVar10->limit).__d.__r = (long)now.__d.__r + 10000000000;
    (pnVar10->src).type_ = addr->type_;
    (pnVar10->src).ipv4_address_.addr_.s_addr = (addr->ipv4_address_).addr_.s_addr;
    uVar2 = *(undefined8 *)((long)&(addr->ipv6_address_).addr_.__in6_u + 8);
    *(undefined8 *)&(pnVar10->src).ipv6_address_.addr_.__in6_u =
         *(undefined8 *)&(addr->ipv6_address_).addr_.__in6_u;
    *(undefined8 *)((long)&(pnVar10->src).ipv6_address_.addr_.__in6_u + 8) = uVar2;
    (pnVar10->src).ipv6_address_.scope_id_ = (addr->ipv6_address_).scope_id_;
    bVar9 = true;
  }
  else {
    iVar5 = pnVar6->count + 1;
    pnVar6->count = iVar5;
    iVar4 = this->m_message_rate_limit * 10;
    bVar9 = true;
    if (SBORROW4(iVar5,iVar4) == iVar5 + this->m_message_rate_limit * -10 < 0) {
      if ((long)now.__d.__r < (pnVar6->limit).__d.__r) {
        if (iVar5 == iVar4) {
          if ((logger != (dht_logger *)0x0) &&
             (iVar4 = (**logger->_vptr_dht_logger)(logger,0), (char)iVar4 != '\0')) {
            print_address_abi_cxx11_(&local_50,(libtorrent *)addr,addr_00);
            auVar11 = SEXT816(((long)now.__d.__r + 10000000000) - (pnVar6->limit).__d.__r) *
                      SEXT816(0x431bde82d7b634db);
            (*logger->_vptr_dht_logger[1])
                      (logger,0,"BANNING PEER [ ip: %s time: %d ms count: %d ]",
                       local_50._M_dataplus._M_p,
                       (ulong)(uint)((int)(auVar11._8_8_ >> 0x12) - (auVar11._12_4_ >> 0x1f)),
                       (ulong)(uint)pnVar6->count);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          (pnVar6->limit).__d.__r = (long)this->m_block_timeout * 1000000000 + (long)now.__d.__r;
        }
        bVar9 = false;
      }
      else {
        pnVar6->count = 0;
        (pnVar6->limit).__d.__r = (long)now.__d.__r + 10000000000;
      }
    }
  }
  return bVar9;
}

Assistant:

bool dos_blocker::incoming(address const& addr, time_point const now, dht_logger* logger)
	{
		TORRENT_UNUSED(logger);
		node_ban_entry* match = nullptr;
		node_ban_entry* min = m_ban_nodes;
		for (node_ban_entry* i = m_ban_nodes; i < m_ban_nodes + num_ban_nodes; ++i)
		{
			if (i->src == addr)
			{
				match = i;
				break;
			}
			if (i->count < min->count) min = i;
			else if (i->count == min->count
				&& i->limit < min->limit) min = i;
		}

		if (match)
		{
			++match->count;

			if (match->count >= m_message_rate_limit * 10)
			{
				if (now < match->limit)
				{
					if (match->count == m_message_rate_limit * 10)
					{
#ifndef TORRENT_DISABLE_LOGGING
						if (logger != nullptr && logger->should_log(dht_logger::tracker))
						{
							logger->log(dht_logger::tracker, "BANNING PEER [ ip: %s time: %d ms count: %d ]"
								, print_address(addr).c_str()
								, int(total_milliseconds((now - match->limit) + seconds(10)))
								, match->count);
						}
#else
						TORRENT_UNUSED(logger);
#endif // TORRENT_DISABLE_LOGGING
						// we've received too many messages in less than 10 seconds
						// from this node. Ignore it until it's silent for 5 minutes
						match->limit = now + seconds(m_block_timeout);
					}

					return false;
				}

				// the messages we received from this peer took more than 10
				// seconds. Reset the counter and the timer
				match->count = 0;
				match->limit = now + seconds(10);
			}
		}
		else
		{
			min->count = 1;
			min->limit = now + seconds(10);
			min->src = addr;
		}
		return true;
	}